

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

char * __thiscall
sentencepiece::ModelProto::_InternalParse(ModelProto *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  int iVar2;
  bool bVar3;
  ModelProto_SentencePiece *msg;
  NormalizerSpec *msg_00;
  SelfTestData *msg_01;
  TrainerSpec *msg_02;
  Rep *pRVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *ptr_00;
  Arena *pAVar6;
  char cVar7;
  uint res;
  pair<const_char_*,_unsigned_int> pVar8;
  byte *local_48;
  ExtensionSet *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_48 = (byte *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &(this->pieces_).super_RepeatedPtrFieldBase;
    local_40 = &this->_extensions_;
    do {
      bVar1 = *local_48;
      res = (uint)bVar1;
      ptr_00 = local_48 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*ptr_00 * 0x80) - 0x80;
        if ((char)*ptr_00 < '\0') {
          pVar8 = google::protobuf::internal::ReadTagFallback((char *)local_48,res);
          ptr_00 = (byte *)pVar8.first;
          if (ptr_00 == (byte *)0x0) {
            return (char *)0x0;
          }
          res = pVar8.second;
        }
        else {
          ptr_00 = local_48 + 2;
        }
      }
      cVar7 = (char)res;
      local_48 = ptr_00;
      switch(res >> 3) {
      case 1:
        if (cVar7 != '\n') break;
        local_48 = ptr_00 + -1;
        do {
          local_48 = local_48 + 1;
          pRVar4 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
            iVar5 = (this->pieces_).super_RepeatedPtrFieldBase.total_size_;
LAB_001b52ff:
            google::protobuf::internal::RepeatedPtrFieldBase::Reserve(local_38,iVar5 + 1);
            pRVar4 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
            iVar5 = pRVar4->allocated_size;
LAB_001b5311:
            pRVar4->allocated_size = iVar5 + 1;
            msg = google::protobuf::Arena::
                  CreateMaybeMessage<sentencepiece::ModelProto_SentencePiece>
                            ((this->pieces_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
            iVar5 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
            (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
            pRVar4->elements[iVar5] = msg;
          }
          else {
            iVar2 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
            iVar5 = pRVar4->allocated_size;
            if (iVar5 <= iVar2) {
              if (iVar5 == (this->pieces_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_001b52ff;
              goto LAB_001b5311;
            }
            (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (ModelProto_SentencePiece *)pRVar4->elements[iVar2];
          }
          local_48 = (byte *)google::protobuf::internal::ParseContext::
                             ParseMessage<sentencepiece::ModelProto_SentencePiece>
                                       (ctx,msg,(char *)local_48);
          if (local_48 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 10));
        goto LAB_001b5508;
      case 2:
        if (cVar7 != '\x12') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        msg_02 = this->trainer_spec_;
        if (msg_02 == (TrainerSpec *)0x0) {
          pAVar6 = (Arena *)this_00->ptr_;
          if (((ulong)pAVar6 & 1) != 0) {
            pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
          }
          msg_02 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::TrainerSpec>(pAVar6);
          this->trainer_spec_ = msg_02;
        }
        local_48 = (byte *)google::protobuf::internal::ParseContext::
                           ParseMessage<sentencepiece::TrainerSpec>(ctx,msg_02,(char *)local_48);
        goto LAB_001b54ff;
      case 3:
        if (cVar7 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          msg_00 = this->normalizer_spec_;
          if (msg_00 == (NormalizerSpec *)0x0) {
            pAVar6 = (Arena *)this_00->ptr_;
            if (((ulong)pAVar6 & 1) != 0) {
              pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
            }
            msg_00 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>
                               (pAVar6);
            this->normalizer_spec_ = msg_00;
          }
LAB_001b53f4:
          local_48 = (byte *)google::protobuf::internal::ParseContext::
                             ParseMessage<sentencepiece::NormalizerSpec>
                                       (ctx,msg_00,(char *)local_48);
          goto LAB_001b54ff;
        }
        break;
      case 4:
        if (cVar7 == '\"') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          msg_01 = this->self_test_data_;
          if (msg_01 == (SelfTestData *)0x0) {
            pAVar6 = (Arena *)this_00->ptr_;
            if (((ulong)pAVar6 & 1) != 0) {
              pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
            }
            msg_01 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::SelfTestData>
                               (pAVar6);
            this->self_test_data_ = msg_01;
          }
          local_48 = (byte *)google::protobuf::internal::ParseContext::
                             ParseMessage<sentencepiece::SelfTestData>(ctx,msg_01,(char *)local_48);
          goto LAB_001b54ff;
        }
        break;
      case 5:
        if (cVar7 == '*') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          msg_00 = this->denormalizer_spec_;
          if (msg_00 == (NormalizerSpec *)0x0) {
            pAVar6 = (Arena *)this_00->ptr_;
            if (((ulong)pAVar6 & 1) != 0) {
              pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
            }
            msg_00 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>
                               (pAVar6);
            this->denormalizer_spec_ = msg_00;
          }
          goto LAB_001b53f4;
        }
      }
      if ((res == 0) || ((res & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)ptr_00;
      }
      if (res < 0x640) {
        if (((ulong)this_00->ptr_ & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_48 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_48,ctx);
      }
      else {
        local_48 = (byte *)google::protobuf::internal::ExtensionSet::ParseField
                                     (local_40,(ulong)res,(char *)ptr_00,
                                      (MessageLite *)_ModelProto_default_instance_,this_00,ctx);
      }
LAB_001b54ff:
      if (local_48 == (byte *)0x0) {
        return (char *)0x0;
      }
LAB_001b5508:
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_48;
}

Assistant:

const char* ModelProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .sentencepiece.ModelProto.SentencePiece pieces = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_pieces(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.TrainerSpec trainer_spec = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_trainer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.NormalizerSpec normalizer_spec = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_normalizer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.SelfTestData self_test_data = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_self_test_data(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.NormalizerSpec denormalizer_spec = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_denormalizer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}